

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

string * __thiscall TCLAP::Arg::shortID(string *__return_storage_ptr__,Arg *this,string *valueId)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_88);
  bVar1 = std::operator!=(&this->_flag,"");
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(&local_88,&bStack_a8,&this->_flag);
  }
  else {
    nameStartString_abi_cxx11_();
    std::operator+(&local_88,&bStack_a8,&this->_name);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
  if (this->_valueRequired == true) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
    std::operator+(&local_48,&local_68,"<");
    std::operator+(&bStack_a8,&local_48,valueId);
    std::operator+(&local_88,&bStack_a8,">");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&bStack_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (this->_required == false) {
    std::operator+(&bStack_a8,"[",__return_storage_ptr__);
    std::operator+(&local_88,&bStack_a8,"]");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&bStack_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::shortID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
		id = Arg::flagStartString() + _flag;
	else
		id = Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId  + ">";

	if ( !_required )
		id = "[" + id + "]";

	return id;
}